

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void pre_text_out(c2m_ctx_t c2m_ctx,token_t t)

{
  pre_ctx *ppVar1;
  FILE *__stream;
  int iVar2;
  char *pcVar3;
  char *local_48;
  FILE *f;
  int i;
  pre_ctx_t pre_ctx;
  token_t t_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->pre_ctx;
  __stream = (FILE *)c2m_ctx->options->prepro_output_file;
  if (((t == (token_t)0x0) && (ppVar1->pre_last_token != (token_t)0x0)) &&
     ((short)*(undefined4 *)ppVar1->pre_last_token == 10)) {
    fprintf(__stream,"\n");
  }
  else if ((short)*(undefined4 *)t == 10) {
    ppVar1->pre_last_token = t;
  }
  else {
    if (((ppVar1->actual_pre_pos).fname != (t->pos).fname) ||
       ((ppVar1->actual_pre_pos).lno != (t->pos).lno)) {
      if (((ppVar1->actual_pre_pos).fname == (t->pos).fname) &&
         (((ppVar1->actual_pre_pos).lno < (t->pos).lno &&
          ((t->pos).lno <= (ppVar1->actual_pre_pos).lno + 4)))) {
        while ((ppVar1->actual_pre_pos).lno != (t->pos).lno) {
          fprintf(__stream,"\n");
          (ppVar1->actual_pre_pos).lno = (ppVar1->actual_pre_pos).lno + 1;
        }
      }
      else {
        if (ppVar1->pre_last_token != (token_t)0x0) {
          fprintf(__stream,"\n");
        }
        fprintf(__stream,"#line %d",(ulong)(uint)(t->pos).lno);
        if ((ppVar1->actual_pre_pos).fname != (t->pos).fname) {
          stringify((t->pos).fname,c2m_ctx->temp_string);
          VARR_charpush(c2m_ctx->temp_string,'\0');
          pcVar3 = VARR_charaddr(c2m_ctx->temp_string);
          fprintf(__stream," %s",pcVar3);
        }
        fprintf(__stream,"\n");
      }
      for (f._4_4_ = 0; f._4_4_ < (t->pos).ln_pos + -1; f._4_4_ = f._4_4_ + 1) {
        fprintf(__stream," ");
      }
      (ppVar1->actual_pre_pos).fname = (t->pos).fname;
      iVar2 = (t->pos).ln_pos;
      (ppVar1->actual_pre_pos).lno = (t->pos).lno;
      (ppVar1->actual_pre_pos).ln_pos = iVar2;
    }
    if ((short)*(undefined4 *)t == 0x20) {
      local_48 = " ";
    }
    else {
      local_48 = t->repr;
    }
    fprintf(__stream,"%s",local_48);
    ppVar1->pre_last_token = t;
  }
  return;
}

Assistant:

static void pre_text_out (c2m_ctx_t c2m_ctx, token_t t) { /* NULL means end of output */
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  int i;
  FILE *f = c2m_options->prepro_output_file;

  if (t == NULL && pre_last_token != NULL && pre_last_token->code == '\n') {
    fprintf (f, "\n");
    return;
  }
  if (t->code == '\n') {
    pre_last_token = t;
    return;
  }
  if (actual_pre_pos.fname != t->pos.fname || actual_pre_pos.lno != t->pos.lno) {
    if (actual_pre_pos.fname == t->pos.fname && actual_pre_pos.lno < t->pos.lno
        && actual_pre_pos.lno + 4 >= t->pos.lno) {
      for (; actual_pre_pos.lno != t->pos.lno; actual_pre_pos.lno++) fprintf (f, "\n");
    } else {
      if (pre_last_token != NULL) fprintf (f, "\n");
      fprintf (f, "#line %d", t->pos.lno);
      if (actual_pre_pos.fname != t->pos.fname) {
        stringify (t->pos.fname, temp_string);
        VARR_PUSH (char, temp_string, '\0');
        fprintf (f, " %s", VARR_ADDR (char, temp_string));
      }
      fprintf (f, "\n");
    }
    for (i = 0; i < t->pos.ln_pos - 1; i++) fprintf (f, " ");
    actual_pre_pos = t->pos;
  }
  fprintf (f, "%s", t->code == ' ' ? " " : t->repr);
  pre_last_token = t;
}